

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::UncheckedInsert(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
                  *this,RecyclerWeakReference<const_Js::PropertyRecord> *weakRef,
                 PropertyGuardEntry *value)

{
  code *pcVar1;
  bool bVar2;
  hash_t hashCode;
  hash_t bucket_00;
  int iVar3;
  int **ppiVar4;
  PropertyRecord *pPVar5;
  undefined4 *puVar6;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar7;
  uint bucket;
  int hash;
  PropertyGuardEntry *value_local;
  RecyclerWeakReference<const_Js::PropertyRecord> *weakRef_local;
  WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
  *this_local;
  
  ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar4 == (int *)0x0) {
    Initialize(this,0);
  }
  pPVar5 = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::FastGet(weakRef);
  hashCode = GetHashCode<Js::PropertyRecord>(this,pPVar5);
  bucket_00 = PrimePolicy::GetBucket(hashCode,this->size,this->modFunctionIndex);
  pPVar5 = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::FastGet(weakRef);
  iVar3 = FindEntry<Js::PropertyRecord>(this,pPVar5);
  if (iVar3 != -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x10a,"(FindEntry(weakRef->FastGet()) == -1)",
                       "FindEntry(weakRef->FastGet()) == -1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pRVar7 = Insert(this,weakRef,value,hashCode,bucket_00);
  return pRVar7;
}

Assistant:

const RecyclerWeakReference<TKey>* UncheckedInsert(const RecyclerWeakReference<TKey>* weakRef, TValue value)
        {
            if (buckets == nullptr) Initialize(0);

            int hash = GetHashCode(weakRef->FastGet());
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            Assert(FindEntry(weakRef->FastGet()) == -1);
            return Insert(weakRef, value, hash, bucket);
        }